

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O2

_Bool compare_intersections(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  _Bool _Var1;
  roaring_bitmap_t *bitmap1;
  roaring_bitmap_t *bitmap2;
  ulong uVar2;
  char *pcVar3;
  
  uVar2 = 1;
  do {
    if (count <= uVar2) {
LAB_00103014:
      return count <= uVar2;
    }
    bitmap1 = roaring_bitmap_and(rnorun[uVar2 - 1],rnorun[uVar2]);
    _Var1 = is_intersection_correct(rnorun[uVar2 - 1],rnorun[uVar2]);
    if (!_Var1) {
      pcVar3 = "no run intersection incorrect";
LAB_0010300f:
      puts(pcVar3);
      goto LAB_00103014;
    }
    _Var1 = is_intersect_correct(rnorun[uVar2 - 1],rnorun[uVar2]);
    if (!_Var1) {
      pcVar3 = "no run intersect incorrect";
      goto LAB_0010300f;
    }
    bitmap2 = roaring_bitmap_and(rruns[uVar2 - 1],rruns[uVar2]);
    _Var1 = is_intersection_correct(rruns[uVar2 - 1],rruns[uVar2]);
    if (!_Var1) {
      pcVar3 = "runs intersection incorrect";
      goto LAB_0010300f;
    }
    _Var1 = is_intersect_correct(rruns[uVar2 - 1],rruns[uVar2]);
    if (!_Var1) {
      pcVar3 = "runs intersect incorrect";
      goto LAB_0010300f;
    }
    _Var1 = slow_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "Intersections don\'t agree! (slow) ";
      goto LAB_0010300f;
    }
    _Var1 = roaring_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "Intersections don\'t agree!";
LAB_00103030:
      puts(pcVar3);
      puts("\n\nbitmap1:");
      roaring_bitmap_printf_describe(bitmap1);
      puts("\n\nbitmap2:");
      roaring_bitmap_printf_describe(bitmap2);
      goto LAB_00103014;
    }
    roaring_bitmap_free(bitmap1);
    roaring_bitmap_free(bitmap2);
    bitmap1 = inplace_intersection(rnorun[uVar2 - 1],rnorun[uVar2]);
    _Var1 = is_intersection_correct(rnorun[uVar2 - 1],rnorun[uVar2]);
    if (!_Var1) {
      pcVar3 = "[inplace] no run intersection incorrect";
      goto LAB_0010300f;
    }
    _Var1 = is_intersect_correct(rnorun[uVar2 - 1],rnorun[uVar2]);
    if (!_Var1) {
      pcVar3 = "[inplace] no run intersect incorrect";
      goto LAB_0010300f;
    }
    bitmap2 = inplace_intersection(rruns[uVar2 - 1],rruns[uVar2]);
    _Var1 = is_intersection_correct(rruns[uVar2 - 1],rruns[uVar2]);
    if (!_Var1) {
      pcVar3 = "[inplace] runs intersection incorrect";
      goto LAB_0010300f;
    }
    _Var1 = is_intersect_correct(rruns[uVar2 - 1],rruns[uVar2]);
    if (!_Var1) {
      pcVar3 = "[inplace] runs intersect incorrect";
      goto LAB_0010300f;
    }
    _Var1 = slow_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "[inplace] Intersections don\'t agree! (slow) ";
      goto LAB_0010300f;
    }
    _Var1 = roaring_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "[inplace] Intersections don\'t agree!";
      goto LAB_00103030;
    }
    roaring_bitmap_free(bitmap1);
    roaring_bitmap_free(bitmap2);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool compare_intersections(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                           size_t count) {
    roaring_bitmap_t *tempandnorun;
    roaring_bitmap_t *tempandruns;
    for (size_t i = 0; i + 1 < count; ++i) {
        tempandnorun = roaring_bitmap_and(rnorun[i], rnorun[i + 1]);
        if (!is_intersection_correct(rnorun[i], rnorun[i + 1])) {
            printf("no run intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rnorun[i], rnorun[i + 1])) {
            printf("no run intersect incorrect\n");
            return false;
        }
        tempandruns = roaring_bitmap_and(rruns[i], rruns[i + 1]);
        if (!is_intersection_correct(rruns[i], rruns[i + 1])) {
            printf("runs intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rruns[i], rruns[i + 1])) {
            printf("runs intersect incorrect\n");
            return false;
        }
        if (!slow_bitmap_equals(tempandnorun, tempandruns)) {
            printf("Intersections don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempandnorun, tempandruns)) {
            printf("Intersections don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempandnorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(tempandruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempandnorun);
        roaring_bitmap_free(tempandruns);

        tempandnorun = inplace_intersection(rnorun[i], rnorun[i + 1]);
        if (!is_intersection_correct(rnorun[i], rnorun[i + 1])) {
            printf("[inplace] no run intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rnorun[i], rnorun[i + 1])) {
            printf("[inplace] no run intersect incorrect\n");
            return false;
        }
        tempandruns = inplace_intersection(rruns[i], rruns[i + 1]);
        if (!is_intersection_correct(rruns[i], rruns[i + 1])) {
            printf("[inplace] runs intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rruns[i], rruns[i + 1])) {
            printf("[inplace] runs intersect incorrect\n");
            return false;
        }
        if (!slow_bitmap_equals(tempandnorun, tempandruns)) {
            printf("[inplace] Intersections don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempandnorun, tempandruns)) {
            printf("[inplace] Intersections don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempandnorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(tempandruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempandnorun);
        roaring_bitmap_free(tempandruns);
    }
    return true;
}